

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O3

void __thiscall diy::AMRLink::load(AMRLink *this,BinaryBuffer *bb)

{
  Serialization<std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>::load
            (bb,&(this->super_Registrar<diy::AMRLink>).super_Link.neighbors_);
  (*bb->_vptr_BinaryBuffer[4])(bb,&this->dim_,4);
  Serialization<diy::AMRLink::Description>::load(bb,&this->local_);
  Serialization<std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>_>
  ::load(bb,&this->nbr_descriptions_);
  Serialization<std::vector<diy::Direction,_std::allocator<diy::Direction>_>_>::load
            (bb,&this->wrap_);
  return;
}

Assistant:

void          load(BinaryBuffer& bb) override
      {
          Link::load(bb);
          diy::load(bb, dim_);
          diy::load(bb, local_);
          diy::load(bb, nbr_descriptions_);
          diy::load(bb, wrap_);
      }